

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.h
# Opt level: O2

void __thiscall CodeGenRegVmContext::CodeGenRegVmContext(CodeGenRegVmContext *this)

{
  CodeGenGenericContext::CodeGenGenericContext(&this->ctx);
  this->x86rvm = (ExecutorX86 *)0x0;
  this->labelCount = 0;
  this->exFunctions = (ExternFuncInfo *)0x0;
  this->exTypes = (ExternTypeInfo *)0x0;
  this->exTypeExtra = (ExternMemberInfo *)0x0;
  this->exLocals = (ExternLocalInfo *)0x0;
  this->exRegVmConstants = (uint *)0x0;
  this->exRegVmConstantsEnd = (uint *)0x0;
  this->exRegVmRegKillInfo = (uchar *)0x0;
  this->exSymbols = (char *)0x0;
  this->vmState = (CodeGenRegVmStateContext *)0x0;
  this->currInstructionPos = 0;
  this->currInstructionRegKillOffset = 0;
  this->currFunctionId = 0;
  return;
}

Assistant:

CodeGenRegVmContext()
	{
		x86rvm = NULL;

		labelCount = 0;

		exFunctions = NULL;
		exTypes = NULL;
		exTypeExtra = NULL;
		exLocals = NULL;
		exRegVmConstants = NULL;
		exRegVmConstantsEnd = NULL;
		exRegVmRegKillInfo = NULL;
		exSymbols = NULL;

		vmState = NULL;

		currInstructionPos = 0;
		currInstructionRegKillOffset = 0;
		currFunctionId = 0;
	}